

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall gl4cts::CopyImage::SmokeTest::SmokeTest(SmokeTest *this,Context *context)

{
  GLenum internal_format;
  GLenum GVar1;
  uint uVar2;
  long lVar3;
  testCase test_case;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"smoke_test","Test tries all formats and targets");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SmokeTest_01dbcc08;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_rb_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0xfffffffb;
  for (lVar3 = 0; lVar3 != 0x2c; lVar3 = lVar3 + 4) {
    if (1 < uVar2) {
      test_case.m_target = *(GLenum *)((long)&s_valid_targets + lVar3);
      test_case.m_internal_format = 0x8d70;
      test_case.m_format = 0x8d99;
      test_case.m_type = 0x1405;
      std::
      vector<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
      ::push_back(&this->m_test_cases,&test_case);
    }
    uVar2 = uVar2 + 1;
  }
  for (lVar3 = 0; lVar3 != 0xf4; lVar3 = lVar3 + 4) {
    internal_format = *(GLenum *)((long)&s_internal_formats + lVar3);
    GVar1 = Utils::getFormat(internal_format);
    test_case.m_type = Utils::getType(internal_format);
    test_case.m_target = 0xde1;
    test_case.m_format = GVar1;
    test_case.m_internal_format = internal_format;
    std::
    vector<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
    ::push_back(&this->m_test_cases,&test_case);
  }
  return;
}

Assistant:

SmokeTest::SmokeTest(deqp::Context& context)
	: TestCase(context, "smoke_test", "Test tries all formats and targets")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_rb_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* Iterate over valid targets */
	for (GLuint tgt_id = 0; tgt_id < s_n_valid_targets; ++tgt_id)
	{
		const GLenum target = s_valid_targets[tgt_id];

		if (true == Utils::isTargetMultisampled(target))
		{
			continue;
		}

		const testCase test_case = { target, GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT };

		m_test_cases.push_back(test_case);
	}

	/* Iterate over internal formats */
	for (GLuint fmt_id = 0; fmt_id < s_n_internal_formats; ++fmt_id)
	{
		const GLenum internal_format = s_internal_formats[fmt_id];
		const GLenum format			 = Utils::getFormat(internal_format);
		const GLenum type			 = Utils::getType(internal_format);

		const testCase test_case = { GL_TEXTURE_2D, internal_format, format, type };

		m_test_cases.push_back(test_case);
	}
}